

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_emit_document_start(yaml_emitter_t *emitter,yaml_event_t *event,int first)

{
  yaml_char_t *pyVar1;
  int iVar2;
  size_t sVar3;
  int local_64;
  yaml_tag_directive_t *pyStack_60;
  int implicit;
  yaml_tag_directive_t *tag_directive;
  yaml_tag_directive_t default_tag_directives [3];
  int first_local;
  yaml_event_t *event_local;
  yaml_emitter_t *emitter_local;
  
  default_tag_directives[2].prefix._4_4_ = first;
  if (event->type == YAML_DOCUMENT_START_EVENT) {
    memcpy(&tag_directive,&DAT_0012ed80,0x30);
    if (((event->data).document_start.version_directive == (yaml_version_directive_t *)0x0) ||
       (iVar2 = yaml_emitter_analyze_version_directive
                          (emitter,*(event->data).document_start.version_directive), iVar2 != 0)) {
      for (pyStack_60 = (event->data).document_start.tag_directives.start;
          pyStack_60 != (event->data).document_start.tag_directives.end; pyStack_60 = pyStack_60 + 1
          ) {
        iVar2 = yaml_emitter_analyze_tag_directive(emitter,*pyStack_60);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = yaml_emitter_append_tag_directive(emitter,*pyStack_60,0);
        if (iVar2 == 0) {
          return 0;
        }
      }
      for (pyStack_60 = (yaml_tag_directive_t *)&tag_directive;
          pyStack_60->handle != (yaml_char_t *)0x0; pyStack_60 = pyStack_60 + 1) {
        iVar2 = yaml_emitter_append_tag_directive(emitter,*pyStack_60,1);
        if (iVar2 == 0) {
          return 0;
        }
      }
      local_64 = (event->data).document_start.implicit;
      if ((default_tag_directives[2].prefix._4_4_ == 0) || (emitter->canonical != 0)) {
        local_64 = 0;
      }
      if ((((event->data).document_start.version_directive != (yaml_version_directive_t *)0x0) ||
          ((event->data).document_start.tag_directives.start !=
           (event->data).document_start.tag_directives.end)) && (emitter->open_ended != 0)) {
        iVar2 = yaml_emitter_write_indicator(emitter,"...",1,0,0);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = yaml_emitter_write_indent(emitter);
        if (iVar2 == 0) {
          return 0;
        }
      }
      if ((event->data).document_start.version_directive != (yaml_version_directive_t *)0x0) {
        local_64 = 0;
        iVar2 = yaml_emitter_write_indicator(emitter,"%YAML",1,0,0);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = yaml_emitter_write_indicator(emitter,"1.1",1,0,0);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = yaml_emitter_write_indent(emitter);
        if (iVar2 == 0) {
          return 0;
        }
      }
      if ((event->data).document_start.tag_directives.start !=
          (event->data).document_start.tag_directives.end) {
        local_64 = 0;
        for (pyStack_60 = (event->data).document_start.tag_directives.start;
            pyStack_60 != (event->data).document_start.tag_directives.end;
            pyStack_60 = pyStack_60 + 1) {
          iVar2 = yaml_emitter_write_indicator(emitter,"%TAG",1,0,0);
          if (iVar2 == 0) {
            return 0;
          }
          pyVar1 = pyStack_60->handle;
          sVar3 = strlen((char *)pyStack_60->handle);
          iVar2 = yaml_emitter_write_tag_handle(emitter,pyVar1,sVar3);
          if (iVar2 == 0) {
            return 0;
          }
          pyVar1 = pyStack_60->prefix;
          sVar3 = strlen((char *)pyStack_60->prefix);
          iVar2 = yaml_emitter_write_tag_content(emitter,pyVar1,sVar3,1);
          if (iVar2 == 0) {
            return 0;
          }
          iVar2 = yaml_emitter_write_indent(emitter);
          if (iVar2 == 0) {
            return 0;
          }
        }
      }
      iVar2 = yaml_emitter_check_empty_document(emitter);
      if (iVar2 != 0) {
        local_64 = 0;
      }
      if (local_64 == 0) {
        iVar2 = yaml_emitter_write_indent(emitter);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = yaml_emitter_write_indicator(emitter,"---",1,0,0);
        if (iVar2 == 0) {
          return 0;
        }
        if ((emitter->canonical != 0) && (iVar2 = yaml_emitter_write_indent(emitter), iVar2 == 0)) {
          return 0;
        }
      }
      emitter->state = YAML_EMIT_DOCUMENT_CONTENT_STATE;
      emitter_local._4_4_ = 1;
    }
    else {
      emitter_local._4_4_ = 0;
    }
  }
  else if (event->type == YAML_STREAM_END_EVENT) {
    iVar2 = yaml_emitter_flush(emitter);
    if (iVar2 == 0) {
      emitter_local._4_4_ = 0;
    }
    else {
      emitter->state = YAML_EMIT_END_STATE;
      emitter_local._4_4_ = 1;
    }
  }
  else {
    emitter_local._4_4_ =
         yaml_emitter_set_emitter_error(emitter,"expected DOCUMENT-START or STREAM-END");
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_emit_document_start(yaml_emitter_t *emitter,
        yaml_event_t *event, int first)
{
    if (event->type == YAML_DOCUMENT_START_EVENT)
    {
        yaml_tag_directive_t default_tag_directives[] = {
            {(yaml_char_t *)"!", (yaml_char_t *)"!"},
            {(yaml_char_t *)"!!", (yaml_char_t *)"tag:yaml.org,2002:"},
            {NULL, NULL}
        };
        yaml_tag_directive_t *tag_directive;
        int implicit;

        if (event->data.document_start.version_directive) {
            if (!yaml_emitter_analyze_version_directive(emitter,
                        *event->data.document_start.version_directive))
                return 0;
        }

        for (tag_directive = event->data.document_start.tag_directives.start;
                tag_directive != event->data.document_start.tag_directives.end;
                tag_directive ++) {
            if (!yaml_emitter_analyze_tag_directive(emitter, *tag_directive))
                return 0;
            if (!yaml_emitter_append_tag_directive(emitter, *tag_directive, 0))
                return 0;
        }

        for (tag_directive = default_tag_directives;
                tag_directive->handle; tag_directive ++) {
            if (!yaml_emitter_append_tag_directive(emitter, *tag_directive, 1))
                return 0;
        }

        implicit = event->data.document_start.implicit;
        if (!first || emitter->canonical) {
            implicit = 0;
        }

        if ((event->data.document_start.version_directive ||
                    (event->data.document_start.tag_directives.start
                     != event->data.document_start.tag_directives.end)) &&
                emitter->open_ended)
        {
            if (!yaml_emitter_write_indicator(emitter, "...", 1, 0, 0))
                return 0;
            if (!yaml_emitter_write_indent(emitter))
                return 0;
        }

        if (event->data.document_start.version_directive) {
            implicit = 0;
            if (!yaml_emitter_write_indicator(emitter, "%YAML", 1, 0, 0))
                return 0;
            if (!yaml_emitter_write_indicator(emitter, "1.1", 1, 0, 0))
                return 0;
            if (!yaml_emitter_write_indent(emitter))
                return 0;
        }

        if (event->data.document_start.tag_directives.start
                != event->data.document_start.tag_directives.end) {
            implicit = 0;
            for (tag_directive = event->data.document_start.tag_directives.start;
                    tag_directive != event->data.document_start.tag_directives.end;
                    tag_directive ++) {
                if (!yaml_emitter_write_indicator(emitter, "%TAG", 1, 0, 0))
                    return 0;
                if (!yaml_emitter_write_tag_handle(emitter, tag_directive->handle,
                            strlen((char *)tag_directive->handle)))
                    return 0;
                if (!yaml_emitter_write_tag_content(emitter, tag_directive->prefix,
                            strlen((char *)tag_directive->prefix), 1))
                    return 0;
                if (!yaml_emitter_write_indent(emitter))
                    return 0;
            }
        }

        if (yaml_emitter_check_empty_document(emitter)) {
            implicit = 0;
        }

        if (!implicit) {
            if (!yaml_emitter_write_indent(emitter))
                return 0;
            if (!yaml_emitter_write_indicator(emitter, "---", 1, 0, 0))
                return 0;
            if (emitter->canonical) {
                if (!yaml_emitter_write_indent(emitter))
                    return 0;
            }
        }

        emitter->state = YAML_EMIT_DOCUMENT_CONTENT_STATE;

        return 1;
    }

    else if (event->type == YAML_STREAM_END_EVENT)
    {

        if (!yaml_emitter_flush(emitter))
            return 0;

        emitter->state = YAML_EMIT_END_STATE;

        return 1;
    }

    return yaml_emitter_set_emitter_error(emitter,
            "expected DOCUMENT-START or STREAM-END");
}